

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::UnitTestImpl::~UnitTestImpl(UnitTestImpl *this)

{
  TestEventRepeater *pTVar1;
  
  this->_vptr_UnitTestImpl = (_func_int **)&PTR__UnitTestImpl_001810e8;
  ForEach<std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>,void(*)(testing::TestSuite*)>
            (&this->test_suites_,Delete<testing::TestSuite>);
  ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
            (&this->environments_,Delete<testing::Environment>);
  if (this->os_stack_trace_getter_ != (OsStackTraceGetterInterface *)0x0) {
    (*this->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface[1])();
  }
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  ::~ThreadLocal(&this->gtest_trace_stack_);
  std::
  unique_ptr<testing::internal::DeathTestFactory,_std::default_delete<testing::internal::DeathTestFactory>_>
  ::~unique_ptr(&this->death_test_factory_);
  std::
  unique_ptr<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
  ::~unique_ptr(&this->internal_run_death_test_flag_);
  pTVar1 = (this->listeners_).repeater_;
  if (pTVar1 != (TestEventRepeater *)0x0) {
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[1])();
  }
  TestResult::~TestResult(&this->ad_hoc_test_result_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->ignored_parameterized_test_suites_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>_>
               *)&this->type_parameterized_test_registry_);
  ParameterizedTestSuiteRegistry::~ParameterizedTestSuiteRegistry
            (&this->parameterized_test_registry_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::~_Vector_base
            (&(this->test_suites_).
              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>);
  std::_Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>::~_Vector_base
            (&(this->environments_).
              super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>);
  ThreadLocal<testing::TestPartResultReporterInterface_*>::~ThreadLocal
            (&this->per_thread_test_part_result_reporter_);
  Mutex::~Mutex(&this->global_test_part_result_reporter_mutex_);
  std::__cxx11::string::~string((string *)&this->original_working_dir_);
  return;
}

Assistant:

UnitTestImpl::~UnitTestImpl() {
  // Deletes every TestSuite.
  ForEach(test_suites_, internal::Delete<TestSuite>);

  // Deletes every Environment.
  ForEach(environments_, internal::Delete<Environment>);

  delete os_stack_trace_getter_;
}